

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConstVector(BinaryWriterSpec *this,ConstVector *consts)

{
  v128 *this_00;
  Enum EVar1;
  long lVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ExpectedNan EVar8;
  ulong uVar9;
  char *pcVar10;
  undefined8 uVar11;
  Const *this_01;
  Stream *pSVar12;
  pointer pCVar13;
  ulong uVar14;
  Type local_44;
  long local_40;
  ConstVector *local_38;
  
  Stream::Writef(this->json_stream_,"[");
  pCVar13 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar13) {
    local_40 = 0;
    uVar14 = 0;
    local_38 = consts;
    do {
      this_01 = pCVar13 + uVar14;
      Stream::Writef(this->json_stream_,"{");
      Stream::Writef(this->json_stream_,"\"%s\": ","type");
      EVar1 = (this_01->type_).enum_;
      switch(EVar1) {
      case Any:
      case ~I64:
switchD_00143ea6_caseD_0:
        abort();
      case Hostref:
        pSVar12 = this->json_stream_;
        pcVar10 = "hostref";
LAB_001441d7:
        Stream::Writef(pSVar12,"\"%s\"",pcVar10);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        uVar11 = *(undefined8 *)(this_01->data_).v;
        pSVar12 = this->json_stream_;
LAB_0014425f:
        Stream::Writef(pSVar12,"\"%lu\"",uVar11);
        break;
      case V128:
        Stream::Writef(this->json_stream_,"\"%s\"","v128");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","lane_type");
        if ((this_01->type_).enum_ != V128) {
LAB_001443b5:
          __assert_fail("type_ == Type::V128",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h"
                        ,0x60,"Type wabt::Const::lane_type() const");
        }
        local_44.enum_ = (this_01->lane_type_).enum_;
        pcVar10 = Type::GetName(&local_44);
        Stream::Writef(this->json_stream_,"\"%s\"",pcVar10);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"[");
        iVar4 = Const::lane_count(this_01);
        lVar2 = local_40;
        if (0 < iVar4) {
          this_00 = &this_01->data_;
          uVar7 = 0;
          do {
            if ((this_01->type_).enum_ != V128) goto LAB_001443b5;
            iVar4 = (int)uVar7;
            switch((this_01->lane_type_).enum_) {
            case I16:
              pSVar12 = this->json_stream_;
              uVar3 = v128::To<unsigned_short>(this_00,iVar4);
              uVar9 = (ulong)uVar3;
              goto LAB_00144039;
            case I8:
              if (0xf < uVar7) {
                __assert_fail("(lane + 1) * sizeof(T) <= sizeof(v)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/common.h"
                              ,0x8d,"T v128::To(int) const [T = unsigned char]");
              }
              pSVar12 = this->json_stream_;
              uVar9 = (ulong)(pCVar13->data_).v[uVar7 + lVar2];
              goto LAB_00144039;
            default:
              goto switchD_00143ea6_caseD_0;
            case F64:
              uVar6 = v128::To<unsigned_long>(this_00,iVar4);
              EVar8 = None;
              if (uVar7 < 4) {
                EVar8 = *(ExpectedNan *)((long)pCVar13->nan_ + uVar7 * 4 + lVar2);
              }
              WriteF64((BinaryWriterSpec *)this->json_stream_,uVar6,EVar8);
              break;
            case F32:
              uVar5 = v128::To<unsigned_int>(this_00,iVar4);
              EVar8 = None;
              if (uVar7 < 4) {
                EVar8 = *(ExpectedNan *)((long)pCVar13->nan_ + uVar7 * 4 + lVar2);
              }
              WriteF32((BinaryWriterSpec *)this->json_stream_,uVar5,EVar8);
              break;
            case I64:
              pSVar12 = this->json_stream_;
              uVar6 = v128::To<unsigned_long>(this_00,iVar4);
              Stream::Writef(pSVar12,"\"%lu\"",uVar6);
              break;
            case I32:
              pSVar12 = this->json_stream_;
              uVar5 = v128::To<unsigned_int>(this_00,iVar4);
              uVar9 = (ulong)uVar5;
LAB_00144039:
              Stream::Writef(pSVar12,"\"%u\"",uVar9);
            }
            iVar4 = Const::lane_count(this_01);
            if (uVar7 != iVar4 - 1) {
              Stream::Writef(this->json_stream_,", ");
            }
            uVar7 = uVar7 + 1;
            iVar4 = Const::lane_count(this_01);
          } while ((long)uVar7 < (long)iVar4);
        }
        Stream::Writef(this->json_stream_,"]");
        consts = local_38;
        break;
      case F64:
        Stream::Writef(this->json_stream_,"\"%s\"","f64");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        WriteF64((BinaryWriterSpec *)this->json_stream_,*(uint64_t *)(this_01->data_).v,
                 this_01->nan_[0]);
        break;
      case F32:
        Stream::Writef(this->json_stream_,"\"%s\"","f32");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        WriteF32((BinaryWriterSpec *)this->json_stream_,*(uint32_t *)(this_01->data_).v,
                 this_01->nan_[0]);
        break;
      case I64:
        Stream::Writef(this->json_stream_,"\"%s\"","i64");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        pSVar12 = this->json_stream_;
        uVar11 = *(undefined8 *)(this_01->data_).v;
        goto LAB_0014425f;
      case I32:
        Stream::Writef(this->json_stream_,"\"%s\"","i32");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"\"%u\"",(ulong)*(uint *)(this_01->data_).v);
        break;
      default:
        if (EVar1 != Nullref) {
          if (EVar1 != Funcref) goto switchD_00143ea6_caseD_0;
          pSVar12 = this->json_stream_;
          pcVar10 = "funcref";
          goto LAB_001441d7;
        }
        Stream::Writef(this->json_stream_,"\"%s\"","nullref");
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","value");
        Stream::Writef(this->json_stream_,"\"0\"");
      }
      Stream::Writef(this->json_stream_,"}");
      pCVar13 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar7 = ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl
                     .super__Vector_impl_data._M_finish - (long)pCVar13 >> 3) * -0x71c71c71c71c71c7;
      if (uVar14 != uVar7 - 1) {
        Stream::Writef(this->json_stream_,", ");
        pCVar13 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar7 = ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pCVar13 >> 3) *
                -0x71c71c71c71c71c7;
      }
      uVar14 = uVar14 + 1;
      local_40 = local_40 + 0x48;
    } while (uVar14 < uVar7);
  }
  Stream::Writef(this->json_stream_,"]");
  return;
}

Assistant:

void BinaryWriterSpec::WriteConstVector(const ConstVector& consts) {
  json_stream_->Writef("[");
  for (size_t i = 0; i < consts.size(); ++i) {
    const Const& const_ = consts[i];
    WriteConst(const_);
    if (i != consts.size() - 1) {
      WriteSeparator();
    }
  }
  json_stream_->Writef("]");
}